

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall
Js::InlineCache::CacheAccessor
          (InlineCache *this,bool isGetter,PropertyId propertyId,PropertyIndex propertyIndex,
          bool isInlineSlot,Type *type,DynamicObject *object,bool isOnProto,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  Type *pTVar5;
  PropertyRecord *pPVar6;
  short sVar7;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x9a,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) goto LAB_00970e9c;
    *puVar3 = 0;
  }
  if (propertyIndex == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x9b,"(propertyIndex != Constants::NoSlot)",
                                "propertyIndex != Constants::NoSlot");
    if (!bVar2) goto LAB_00970e9c;
    *puVar3 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x9c,"(type)","type");
    if (!bVar2) goto LAB_00970e9c;
    *puVar3 = 0;
  }
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x9d,"(object)","object");
    if (!bVar2) goto LAB_00970e9c;
    *puVar3 = 0;
  }
  pSVar4 = requestContext;
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x9e,"(requestContext)","requestContext");
    if (!bVar2) goto LAB_00970e9c;
    *puVar3 = 0;
    pSVar4 = (ScriptContext *)0x0;
  }
  VerifyRegistrationForInvalidation(this,pSVar4,propertyId);
  pSVar4 = Js::Type::GetScriptContext(type);
  if (pSVar4 != requestContext) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0xa2,"(type->GetScriptContext() == requestContext)",
                                "type->GetScriptContext() == requestContext");
    if (!bVar2) {
LAB_00970e9c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  requestContext->hasUsedInlineCache = true;
  Memory::InlineCacheAllocator::Unlock(&requestContext->inlineCacheAllocator);
  if (isOnProto) {
    sVar7 = 8;
    if (this->invalidationListSlotPtr == (InlineCache **)0x0) {
      if (isGetter) {
        ScriptContext::RegisterProtoInlineCache(requestContext,this,propertyId);
      }
      else {
        ScriptContext::RegisterStoreFieldInlineCache(requestContext,this,propertyId);
      }
    }
  }
  else {
    sVar7 = 0;
  }
  (this->u).accessor.field_1.rawUInt16 =
       ((ushort)*(undefined4 *)((long)&this->u + 8) & 0xfff0) + sVar7 + (ushort)!isGetter * 2 + 3;
  pTVar5 = (Type *)((ulong)type | 4);
  if (isInlineSlot) {
    pTVar5 = type;
  }
  (this->u).proto.prototypeObject = (DynamicObject *)pTVar5;
  (this->u).accessor.slotIndex = propertyIndex;
  (this->u).accessor.object = object;
  type->flags = type->flags | TypeFlagMask_HasBeenCached;
  VerifyRegistrationForInvalidation(this,requestContext,propertyId);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
  if ((bVar2) && (DAT_015bc46a == '\x01')) {
    pPVar6 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"IC::CacheAccessor, %s: ",pPVar6 + 1);
    Dump(this);
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void InlineCache::CacheAccessor(
        const bool isGetter,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        Type *const type,
        DynamicObject *const object,
        const bool isOnProto,
        ScriptContext *const requestContext)
    {
        Assert(propertyId != Constants::NoProperty);
        Assert(propertyIndex != Constants::NoSlot);
        Assert(type);
        Assert(object);
        Assert(requestContext);
        DebugOnly(VerifyRegistrationForInvalidation(this, requestContext, propertyId));
        // It is possible that prototype is from a different scriptContext than the original instance. We don't want to cache
        // in this case.
        Assert(type->GetScriptContext() == requestContext);

        requestContext->SetHasUsedInlineCache(true);

        if (isOnProto && invalidationListSlotPtr == nullptr)
        {
            // Note, this can throw due to OOM, so we need to do it before the inline cache is set below.
            if (!isGetter)
            {
                // If the setter is on a prototype, this cache must be invalidated whenever proto
                // caches are invalidated, so we must register it here.  Note that store field inline
                // caches are invalidated any time proto caches are invalidated.
                requestContext->RegisterStoreFieldInlineCache(this, propertyId);
            }
            else
            {
                requestContext->RegisterProtoInlineCache(this, propertyId);
            }
        }

        u.accessor.isAccessor = true;
        // TODO (PersistentInlineCaches): Consider removing the flag altogether and just have a bit indicating
        // whether the cache itself is a store field cache (isStore?).
        u.accessor.flags = isGetter ? InlineCacheGetterFlag : InlineCacheSetterFlag;
        u.accessor.isOnProto = isOnProto;
        u.accessor.type = isInlineSlot ? type : TypeWithAuxSlotTag(type);
        u.accessor.slotIndex = propertyIndex;
        u.accessor.object = object;

        type->SetHasBeenCached();

        DebugOnly(VerifyRegistrationForInvalidation(this, requestContext, propertyId));

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            Output::Print(_u("IC::CacheAccessor, %s: "), requestContext->GetPropertyName(propertyId)->GetBuffer());
            Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }